

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O0

void __thiscall Text::append(Text *this,TextSlice slice)

{
  long lVar1;
  size_type sVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  size_type local_98;
  size_t i;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  uint *local_78;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  const_iterator local_50;
  size_type local_48;
  size_t original_size;
  char16_t *local_38;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_30;
  __normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_28;
  const_iterator local_20;
  long local_18;
  int64_t line_offset_delta;
  Text *this_local;
  
  line_offset_delta = (int64_t)this;
  sVar2 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                    (&this->content);
  sVar3 = TextSlice::start_offset(&slice);
  local_18 = sVar2 - sVar3;
  local_28._M_current =
       (char16_t *)
       std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
       end(&this->content);
  __gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>::
  __normal_iterator<char16_t*>
            ((__normal_iterator<char16_t_const*,std::__cxx11::u16string> *)&local_20,&local_28);
  local_30._M_current = (char16_t *)TextSlice::begin_abi_cxx11_(&slice);
  local_38 = (char16_t *)TextSlice::end_abi_cxx11_(&slice);
  original_size =
       (size_t)std::__cxx11::u16string::
               insert<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,void>
                         ((u16string *)this,local_20,local_30,
                          (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                           )local_38);
  local_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->line_offsets);
  local_58._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->line_offsets);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_50,&local_58);
  local_70._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&(slice.text)->line_offsets);
  local_68 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_70,(ulong)slice.start_position.row);
  local_60 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_68,1);
  local_88._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&(slice.text)->line_offsets);
  local_80 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_88,(ulong)slice.end_position.row);
  local_78 = (uint *)__gnu_cxx::
                     __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator+(&local_80,1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->line_offsets,local_50,
             local_60,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )local_78);
  local_98 = local_48;
  while( true ) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->line_offsets);
    lVar1 = local_18;
    if (sVar4 <= local_98) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->line_offsets,local_98);
    *pvVar5 = *pvVar5 + (int)lVar1;
    local_98 = local_98 + 1;
  }
  return;
}

Assistant:

void Text::append(TextSlice slice) {
  int64_t line_offset_delta = static_cast<int64_t>(content.size()) - static_cast<int64_t>(slice.start_offset());

  content.insert(
    content.end(),
    slice.begin(),
    slice.end()
  );

  size_t original_size = line_offsets.size();
  line_offsets.insert(
    line_offsets.end(),
    slice.text->line_offsets.begin() + slice.start_position.row + 1,
    slice.text->line_offsets.begin() + slice.end_position.row + 1
  );

  for (size_t i = original_size; i < line_offsets.size(); i++) {
    line_offsets[i] += line_offset_delta;
  }
}